

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

StringRef __thiscall Catch::trim(Catch *this,StringRef ref)

{
  char *pcVar1;
  Catch *pCVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  StringRef SVar10;
  
  pcVar5 = ref.m_start;
  bVar9 = pcVar5 != (char *)0x0;
  if (pcVar5 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)0x0;
    do {
      pcVar4 = pcVar3;
      if ((0x20 < (ulong)(byte)this[(long)pcVar3]) ||
         ((0x100002600U >> ((ulong)(byte)this[(long)pcVar3] & 0x3f) & 1) == 0)) break;
      pcVar3 = pcVar3 + 1;
      bVar9 = pcVar3 < pcVar5;
      pcVar4 = pcVar5;
    } while (pcVar3 != pcVar5);
  }
  uVar6 = (long)pcVar5 - (long)pcVar4;
  pcVar3 = pcVar5;
  pcVar7 = pcVar5;
  if (pcVar4 <= pcVar5 && uVar6 != 0) {
    do {
      pcVar1 = pcVar7 + -1;
      if (pcVar5 <= pcVar1) {
        __assert_fail("index < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                      ,0x283,"char Catch::StringRef::operator[](size_type) const");
      }
      pcVar3 = pcVar7;
    } while ((((ulong)(byte)(this + -1)[(long)pcVar7] < 0x21) &&
             ((0x100002600U >> ((ulong)(byte)(this + -1)[(long)pcVar7] & 0x3f) & 1) != 0)) &&
            (pcVar3 = pcVar4, pcVar7 = pcVar1, pcVar4 < pcVar1));
  }
  uVar8 = (long)pcVar3 - (long)pcVar4;
  if (uVar6 < (ulong)((long)pcVar3 - (long)pcVar4)) {
    uVar8 = uVar6;
  }
  uVar6 = 0;
  if (bVar9) {
    uVar6 = uVar8;
  }
  pCVar2 = (Catch *)0x16d5ac;
  if (bVar9) {
    pCVar2 = this + (long)pcVar4;
  }
  SVar10.m_size = uVar6;
  SVar10.m_start = (char *)pCVar2;
  return SVar10;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }